

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

bool ExportModel(aiScene *pOut,ImportData *imp,string *path,char *pID)

{
  Exporter *this;
  aiReturn aVar1;
  char *pcVar2;
  clock_t cVar3;
  int __sig;
  ulong uVar4;
  __pid_t __pid;
  allocator<char> local_59;
  clock_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (imp->log == true) {
    SetLogStreams(imp);
  }
  puts("Launching asset export ...           OK");
  if (imp->showLog == true) {
    puts("-----------------------------------------------------------------");
  }
  local_58 = clock();
  this = globalExporter;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pID,&local_59);
  aVar1 = Assimp::Exporter::Export
                    (this,pOut,(char *)local_50[0],(path->_M_dataplus)._M_p,0,
                     (ExportProperties *)0x0);
  __sig = (int)pOut;
  if (local_50[0] != local_40) {
    uVar4 = local_40[0] + 1;
    operator_delete(local_50[0],uVar4);
    __sig = (int)uVar4;
  }
  if (imp->showLog == true) {
    puts("-----------------------------------------------------------------");
  }
  if (aVar1 == aiReturn_SUCCESS) {
    cVar3 = clock();
    __pid = 0x6a3210;
    printf("Exporting file ...                   OK \n   export took approx. %.5f seconds\n\n",
           (double)(cVar3 - local_58) / 1000000.0);
    if (imp->log == true) {
      Assimp::DefaultLogger::kill(__pid,__sig);
    }
  }
  else {
    puts("Failed to write file");
    pcVar2 = Assimp::Exporter::GetErrorString(globalExporter);
    printf("ERROR: %s\n",pcVar2);
  }
  return aVar1 == aiReturn_SUCCESS;
}

Assistant:

bool ExportModel(const aiScene* pOut,  
	const ImportData& imp, 
	const std::string& path,
	const char* pID)
{
	// Attach log streams
	if (imp.log) {
		SetLogStreams(imp);
	}
	printf("Launching asset export ...           OK\n");

	if (imp.showLog) {
		PrintHorBar();
	}

	// do the actual export, measure time
	const clock_t first = clock();
	const aiReturn res = globalExporter->Export(pOut,pID,path);

	if (imp.showLog) {
		PrintHorBar();
	}
	if (res != AI_SUCCESS) {
		printf("Failed to write file\n");
		printf("ERROR: %s\n", globalExporter->GetErrorString());
		return false;
	}

	const clock_t second = ::clock();
	const double seconds = static_cast<double>(second-first) / CLOCKS_PER_SEC;

	printf("Exporting file ...                   OK \n   export took approx. %.5f seconds\n"
		"\n",seconds);

	if (imp.log) { 
		FreeLogStreams();
	}

	return true;
}